

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_writer_init_stdfile(mpack_writer_t *writer,FILE *file,_Bool close_when_done)

{
  char *pcVar1;
  code *pcVar2;
  
  pcVar1 = (char *)malloc(0x1000);
  writer->version = mpack_version_current;
  writer->flush = (mpack_writer_flush_t)0x0;
  writer->error_fn = (mpack_writer_error_t)0x0;
  writer->teardown = (mpack_writer_teardown_t)0x0;
  writer->context = (void *)0x0;
  writer->buffer = (char *)0x0;
  writer->current = (char *)0x0;
  *(undefined8 *)((long)&writer->current + 4) = 0;
  *(undefined8 *)((long)&writer->end + 4) = 0;
  if (pcVar1 == (char *)0x0) {
    writer->error = mpack_error_memory;
    if (close_when_done) {
      fclose((FILE *)file);
      return;
    }
  }
  else {
    writer->buffer = pcVar1;
    writer->current = pcVar1;
    writer->end = pcVar1 + 0x1000;
    writer->context = file;
    writer->flush = mpack_file_writer_flush;
    pcVar2 = mpack_file_writer_teardown;
    if (close_when_done) {
      pcVar2 = mpack_file_writer_teardown_close;
    }
    writer->teardown = pcVar2;
  }
  return;
}

Assistant:

void mpack_writer_init_stdfile(mpack_writer_t* writer, FILE* file, bool close_when_done) {
    mpack_assert(file != NULL, "file is NULL");

    size_t capacity = MPACK_BUFFER_SIZE;
    char* buffer = (char*)MPACK_MALLOC(capacity);
    if (buffer == NULL) {
        mpack_writer_init_error(writer, mpack_error_memory);
        if (close_when_done) {
            fclose(file);
        }
        return;
    }

    mpack_writer_init(writer, buffer, capacity);
    mpack_writer_set_context(writer, file);
    mpack_writer_set_flush(writer, mpack_file_writer_flush);
    mpack_writer_set_teardown(writer, close_when_done ?
            mpack_file_writer_teardown_close :
            mpack_file_writer_teardown);
}